

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O2

void __thiscall
CMU462::PathTracer::raytrace_tile(PathTracer *this,int tile_x,int tile_y,int tile_w,int tile_h)

{
  int *piVar1;
  ulong uVar2;
  pointer pSVar3;
  ulong uVar4;
  long lVar5;
  size_t y_00;
  size_t extraout_RDX;
  size_t x;
  ulong uVar6;
  ulong x0;
  ulong x_00;
  long lVar7;
  ulong x1;
  long lVar8;
  size_t y;
  ulong y0;
  ulong uVar9;
  Spectrum SVar10;
  
  uVar4 = (this->sampleBuffer).w;
  uVar2 = (this->sampleBuffer).h;
  x0 = (ulong)tile_x;
  y0 = (ulong)tile_y;
  x1 = (long)tile_w + x0;
  if (uVar4 < (long)tile_w + x0) {
    x1 = uVar4;
  }
  uVar4 = (long)tile_h + y0;
  if (uVar2 < (long)tile_h + y0) {
    uVar4 = uVar2;
  }
  uVar2 = this->imageTileSize;
  y_00 = y0 % uVar2;
  lVar8 = y0 * 0xc;
  x_00 = x0;
  uVar9 = y0;
  while( true ) {
    if (uVar4 <= uVar9) {
      piVar1 = (this->tile_samples).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + x0 / uVar2 + (y0 / uVar2) * this->num_tiles_w;
      *piVar1 = *piVar1 + 1;
      HDRImageBuffer::toColor(&this->sampleBuffer,&this->frameBuffer,x0,y0,x1,uVar4);
      return;
    }
    uVar6 = x0;
    lVar7 = x0 * 0xc + 8;
    if (this->continueRaytracing != true) break;
    for (; uVar6 < x1; uVar6 = uVar6 + 1) {
      SVar10 = raytrace_pixel(this,x_00,y_00);
      lVar5 = (this->sampleBuffer).w * lVar8;
      pSVar3 = (this->sampleBuffer).data.
               super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)pSVar3 + lVar7 + -8 + lVar5) = SVar10._0_8_;
      *(float *)((long)&pSVar3->r + lVar7 + lVar5) = SVar10.b;
      y_00 = extraout_RDX;
      lVar7 = lVar7 + 0xc;
    }
    uVar9 = uVar9 + 1;
    lVar8 = lVar8 + 0xc;
  }
  return;
}

Assistant:

void PathTracer::raytrace_tile(int tile_x, int tile_y,
      int tile_w, int tile_h) {

    size_t w = sampleBuffer.w;
    size_t h = sampleBuffer.h;

    size_t tile_start_x = tile_x;
    size_t tile_start_y = tile_y;

    size_t tile_end_x = std::min(tile_start_x + tile_w, w);
    size_t tile_end_y = std::min(tile_start_y + tile_h, h);

    size_t tile_idx_x = tile_x / imageTileSize;
    size_t tile_idx_y = tile_y / imageTileSize;
    size_t num_samples_tile = tile_samples[tile_idx_x + tile_idx_y * num_tiles_w];

    for (size_t y = tile_start_y; y < tile_end_y; y++) {
      if (!continueRaytracing) return;
      for (size_t x = tile_start_x; x < tile_end_x; x++) {
        Spectrum s = raytrace_pixel(x, y);
        sampleBuffer.update_pixel(s, x, y);
      }
    }

    tile_samples[tile_idx_x + tile_idx_y * num_tiles_w] += 1;
    sampleBuffer.toColor(frameBuffer, tile_start_x, tile_start_y, tile_end_x, tile_end_y);
  }